

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

void pack_int(char **buf,ck_uint32 val)

{
  char *pcVar1;
  ck_uint32 uval;
  uchar *ubuf;
  ck_uint32 val_local;
  char **buf_local;
  
  pcVar1 = *buf;
  *pcVar1 = (char)(val >> 0x18);
  pcVar1[1] = (char)(val >> 0x10);
  pcVar1[2] = (char)(val >> 8);
  pcVar1[3] = (char)val;
  *buf = *buf + 4;
  return;
}

Assistant:

static void pack_int(char **buf, ck_uint32 val)
{
    unsigned char *ubuf = (unsigned char *)*buf;
    ck_uint32 uval = val;

    ubuf[0] = (unsigned char)((uval >> 24) & 0xFF);
    ubuf[1] = (unsigned char)((uval >> 16) & 0xFF);
    ubuf[2] = (unsigned char)((uval >> 8) & 0xFF);
    ubuf[3] = (unsigned char)(uval & 0xFF);

    *buf += 4;
}